

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmxmdp.cpp
# Opt level: O2

void __thiscall GMXMDP::setAB(GMXMDP *this)

{
  dblopts *key2opt;
  pointer pGVar1;
  GMXPGRP *pgrp;
  pointer pGVar2;
  string local_78;
  string local_58;
  allocator local_32;
  allocator local_31;
  
  std::__cxx11::string::string((string *)&local_78,"ref-t",&local_31);
  std::__cxx11::string::string((string *)&local_58,"sim-temp-high",&local_32);
  key2opt = &this->key2val;
  setMDPABpair<double>(key2opt,&local_78,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string((string *)&local_78,"ref-p",&local_31);
  std::__cxx11::string::string((string *)&local_58,"sim-press-high",&local_32);
  setMDPABpair<double>(key2opt,&local_78,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string((string *)&local_78,"high",&local_31);
  std::__cxx11::string::string((string *)&local_58,"low",&local_32);
  setMDPABpair<double>(key2opt,&local_78,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  pGVar1 = (this->pgrps).super__Vector_base<GMXMDP::GMXPGRP,_std::allocator<GMXMDP::GMXPGRP>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pGVar2 = (this->pgrps).super__Vector_base<GMXMDP::GMXPGRP,_std::allocator<GMXMDP::GMXPGRP>_>.
                _M_impl.super__Vector_impl_data._M_start; pGVar2 != pGVar1; pGVar2 = pGVar2 + 1) {
    std::__cxx11::string::string((string *)&local_78,"",&local_31);
    std::__cxx11::string::string((string *)&local_58,"B",&local_32);
    setMDPABpair<double>(&pGVar2->key2val,&local_78,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::string((string *)&local_78,"",&local_31);
    std::__cxx11::string::string((string *)&local_58,"B",&local_32);
    setMDPABpair<std::vector<double,std::allocator<double>>>(&pGVar2->key2vvec,&local_78,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return;
}

Assistant:

void GMXMDP::setAB() {
  //First set the temperature to ref-t
  setMDPABpair(key2val, "ref-t", "sim-temp-high");
  //Do the same thing to pressure
  setMDPABpair(key2val, "ref-p", "sim-press-high");
  //Now sync. the high and low pressure/temperature
  setMDPABpair(key2val, "high", "low");
  //Then are the pull-group parameters
  for(auto& pgrp : pgrps) {
    setMDPABpair(pgrp.key2val);
    setMDPABpair(pgrp.key2vvec);
  }
}